

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::throw_exception<hta::Exception,char_const*>(char *args)

{
  Exception *this;
  string local_1d0;
  make_exception<const_char_*> local_199;
  stringstream local_198 [8];
  stringstream msg;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_198);
  detail::make_exception<const_char_*>::operator()(&local_199,(stringstream *)local_198,args);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1d0);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}